

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_ListSingleDash_Test::ClCommandLine_ListSingleDash_Test
          (ClCommandLine_ListSingleDash_Test *this)

{
  ClCommandLine_ListSingleDash_Test *this_local;
  
  anon_unknown.dwarf_19dfa::ClCommandLine::ClCommandLine(&this->super_ClCommandLine);
  (this->super_ClCommandLine).super_Test._vptr_Test =
       (_func_int **)&PTR__ClCommandLine_ListSingleDash_Test_00245148;
  return;
}

Assistant:

TEST_F (ClCommandLine, ListSingleDash) {
    list<std::string> opt{"o"};

    this->add ("progname", "-oa", "-o", "b", "-oc");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_THAT (opt, testing::ElementsAre ("a", "b", "c"));
}